

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

void __thiscall
Pda::addFunct(Pda *this,Node *from,Node *to,char oldStack,string *newStack,char input)

{
  Transition *this_00;
  char oldStack_local;
  Transition *t;
  
  oldStack_local = oldStack;
  this_00 = (Transition *)operator_new(0x40);
  Tjen::Node::Transition::Transition(this_00,from,to,&oldStack_local,newStack,input);
  t = this_00;
  std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::push_back
            (&this->alltransitions,&t);
  Tjen::Node::addFunct(from,t);
  return;
}

Assistant:

void Pda::addFunct(Tjen::Node *from, Tjen::Node *to, char oldStack, std::string newStack, const char input) {
    Tjen::Node::Transition* t = new Tjen::Node::Transition(from,to,oldStack,newStack,input);
    this->alltransitions.push_back(t);
    from->addFunct(t);
}